

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel.h
# Opt level: O2

result_type __thiscall
QtPrivate::QHashCombine::operator()(QHashCombine *this,size_t seed,QModelIndex *t)

{
  return (seed >> 2) + seed * 0x40 + (long)t->c + (long)t->r * 0x10 + t->i + 0x9e3779b9 ^ seed;
}

Assistant:

constexpr inline int column() const noexcept { return c; }